

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64
drwav_read_pcm_frames_s16le(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  drwav_uint32 dVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  drwav_uint64 dVar4;
  ulong uVar5;
  int iVar6;
  size_t sampleCount;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  ulong sampleCount_00;
  drwav_int16 *pdVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  double adStack_1038 [513];
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) goto LAB_00106dd3;
  if (pBufferOut == (drwav_int16 *)0x0) {
    dVar3 = drwav_read_pcm_frames_le(pWav,framesToRead,(void *)0x0);
    return dVar3;
  }
  dVar3 = 0;
  switch(pWav->translatedFormatTag) {
  case 1:
    if (pWav->bitsPerSample == 0x10) {
      dVar3 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
      return dVar3;
    }
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    if (dVar1 != 0) {
      dVar3 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return dVar3;
        }
        uVar5 = 0x1000 / (ulong)dVar1;
        if (framesToRead < uVar5) {
          uVar5 = framesToRead;
        }
        dVar4 = drwav_read_pcm_frames_le(pWav,uVar5,adStack_1038);
        if (dVar4 == 0) break;
        sampleCount_00 = dVar4 * pWav->channels;
        uVar5 = (ulong)dVar1 / (ulong)pWav->channels;
        uVar2 = (uint)uVar5;
        switch(uVar2) {
        case 1:
          drwav_u8_to_s16(pBufferOut,(drwav_uint8 *)adStack_1038,sampleCount_00);
          break;
        case 2:
          for (uVar5 = 0; uVar7 = uVar5 & 0xffffffff,
              uVar7 <= sampleCount_00 && sampleCount_00 - uVar7 != 0; uVar5 = uVar5 + 1) {
            pBufferOut[uVar5] = *(drwav_int16 *)((long)adStack_1038 + uVar7 * 2);
          }
          break;
        case 3:
          drwav_s24_to_s16(pBufferOut,(drwav_uint8 *)adStack_1038,sampleCount_00);
          break;
        case 4:
          drwav_s32_to_s16(pBufferOut,(drwav_int32 *)adStack_1038,sampleCount_00);
          break;
        default:
          if (uVar2 < 9) {
            pdVar9 = adStack_1038;
            pdVar10 = pBufferOut;
            for (uVar7 = 0; uVar7 <= sampleCount_00 && sampleCount_00 - uVar7 != 0;
                uVar7 = (ulong)((int)uVar7 + 1)) {
              lVar8 = 0;
              uVar11 = 0;
              uVar12 = uVar5;
              iVar6 = uVar2 * -8 + 0x40;
              while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
                uVar11 = uVar11 | (ulong)*(byte *)((long)pdVar9 + lVar8) << ((byte)iVar6 & 0x3f);
                iVar6 = iVar6 + 8;
                lVar8 = lVar8 + 1;
              }
              pdVar9 = (double *)((long)pdVar9 + uVar5);
              *pdVar10 = (drwav_int16)(uVar11 >> 0x30);
              pdVar10 = pdVar10 + 1;
            }
          }
          else {
            memset(pBufferOut,0,sampleCount_00 * 2);
          }
        }
        pBufferOut = pBufferOut + pWav->channels * dVar4;
        framesToRead = framesToRead - dVar4;
        dVar3 = dVar3 + dVar4;
      }
      return dVar3;
    }
    goto LAB_00106dd3;
  case 2:
    dVar3 = drwav_read_pcm_frames_s16__msadpcm(pWav,framesToRead,pBufferOut);
    return dVar3;
  case 3:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    if (dVar1 != 0) {
      dVar3 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return dVar3;
        }
        uVar5 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar5 = framesToRead;
        }
        dVar4 = drwav_read_pcm_frames_le(pWav,uVar5,adStack_1038);
        if (dVar4 == 0) break;
        sampleCount = dVar4 * pWav->channels;
        uVar2 = dVar1 / pWav->channels;
        if (uVar2 == 8) {
          drwav_f64_to_s16(pBufferOut,adStack_1038,sampleCount);
        }
        else if (uVar2 == 4) {
          drwav_f32_to_s16(pBufferOut,(float *)adStack_1038,sampleCount);
        }
        else {
          memset(pBufferOut,0,sampleCount * 2);
        }
        pBufferOut = pBufferOut + pWav->channels * dVar4;
        framesToRead = framesToRead - dVar4;
        dVar3 = dVar3 + dVar4;
      }
      return dVar3;
    }
LAB_00106dd3:
    dVar3 = 0;
    break;
  case 4:
  case 5:
    break;
  case 6:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    dVar4 = 0;
    dVar3 = 0;
    if (dVar1 != 0) {
      for (; dVar3 = dVar4, framesToRead != 0; framesToRead = framesToRead - dVar3) {
        uVar5 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar5 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_le(pWav,uVar5,adStack_1038);
        if (dVar3 == 0) {
          return dVar4;
        }
        drwav_alaw_to_s16(pBufferOut,(drwav_uint8 *)adStack_1038,pWav->channels * dVar3);
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        dVar4 = dVar4 + dVar3;
      }
    }
    break;
  case 7:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    dVar3 = 0;
    if (dVar1 != 0) {
      for (; framesToRead != 0; framesToRead = framesToRead - dVar4) {
        uVar5 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar5 = framesToRead;
        }
        dVar4 = drwav_read_pcm_frames_le(pWav,uVar5,adStack_1038);
        if (dVar4 == 0) {
          return dVar3;
        }
        drwav_mulaw_to_s16(pBufferOut,(drwav_uint8 *)adStack_1038,pWav->channels * dVar4);
        pBufferOut = pBufferOut + pWav->channels * dVar4;
        dVar3 = dVar3 + dVar4;
      }
    }
    break;
  default:
    if (pWav->translatedFormatTag == 0x11) {
      dVar3 = drwav_read_pcm_frames_s16__ima(pWav,framesToRead,pBufferOut);
      return dVar3;
    }
  }
  return dVar3;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s16le(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    drwav_uint64 framesRead = drwav_read_pcm_frames_s16(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && drwav__is_little_endian() == DRWAV_FALSE) {
        drwav__bswap_samples_s16(pBufferOut, framesRead*pWav->channels);
    }

    return framesRead;
}